

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_index.cpp
# Opt level: O2

string * __thiscall
duckdb::BoundIndex::AppendRowError_abi_cxx11_
          (string *__return_storage_ptr__,BoundIndex *this,DataChunk *input,idx_t index)

{
  ulong col_idx;
  string local_90;
  Value local_70;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (col_idx = 0;
      col_idx < (ulong)(((long)(this->super_Index).column_ids.
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start -
                        (long)(this->super_Index)._vptr_Index) / 0x68); col_idx = col_idx + 1) {
    if (col_idx != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    DataChunk::GetValue(&local_70,(DataChunk *)this,col_idx,(idx_t)input);
    Value::ToString_abi_cxx11_(&local_90,&local_70);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_90);
    Value::~Value(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoundIndex::AppendRowError(DataChunk &input, idx_t index) {
	string error;
	for (idx_t c = 0; c < input.ColumnCount(); c++) {
		if (c > 0) {
			error += ", ";
		}
		error += input.GetValue(c, index).ToString();
	}
	return error;
}